

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cc
# Opt level: O1

void sptk::world::InitializeCheapTrickOption(int fs,CheapTrickOption *option)

{
  double dVar1;
  
  option->q1 = -0.15;
  option->f0_floor = 71.0;
  dVar1 = log(((double)fs * 3.0) / 71.0 + 1.0);
  dVar1 = exp2((double)(int)(dVar1 / 0.6931471805599453) + 1.0);
  option->fft_size = (int)dVar1;
  return;
}

Assistant:

void InitializeCheapTrickOption(int fs, CheapTrickOption *option) {
  // q1 is the parameter used for the spectral recovery.
  // Since The parameter is optimized, you don't need to change the parameter.
  option->q1 = -0.15;
  // f0_floor and fs are used to determine fft_size;
  // We strongly recommend not to change this value unless you have enough
  // knowledge of the signal processing in CheapTrick.
  option->f0_floor = world::kFloorF0;
  option->fft_size = GetFFTSizeForCheapTrick(fs, option);
}